

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O0

void writecb(bufferevent *bev,void *ptr)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  http2_session_data *in_RSI;
  http2_session_data *session_data;
  http2_session_data *session_data_00;
  
  session_data_00 = in_RSI;
  iVar1 = nghttp2_session_want_read(in_RSI->session);
  if (iVar1 == 0) {
    iVar1 = nghttp2_session_want_write(in_RSI->session);
    if (iVar1 == 0) {
      uVar2 = bufferevent_get_output(in_RSI->bev);
      lVar3 = evbuffer_get_length(uVar2);
      if (lVar3 == 0) {
        delete_http2_session_data(session_data_00);
      }
    }
  }
  return;
}

Assistant:

static void writecb(struct bufferevent *bev, void *ptr) {
  http2_session_data *session_data = (http2_session_data *)ptr;
  (void)bev;

  if (nghttp2_session_want_read(session_data->session) == 0 &&
      nghttp2_session_want_write(session_data->session) == 0 &&
      evbuffer_get_length(bufferevent_get_output(session_data->bev)) == 0) {
    delete_http2_session_data(session_data);
  }
}